

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O3

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  int iVar3;
  
  ppcVar1 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppcVar2 == ppcVar1) {
      return false;
    }
    iVar3 = (*((*ppcVar2)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])();
    ppcVar2 = (pointer)((long)ppcVar2 + 8);
  } while ((char)iVar3 == '\0');
  return (bool)(char)iVar3;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (auto generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}